

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

pair<unsigned_long,_absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>_>
* __thiscall
absl::container_internal::
btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
::erase_range(pair<unsigned_long,_absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>_>
              *__return_storage_ptr__,
             btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
             *this,iterator begin,iterator end)

{
  undefined1 auVar1 [12];
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *this_00;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *pbVar5;
  int iVar6;
  ulong uVar7;
  unsigned_long uVar8;
  iterator iVar9;
  iterator iter;
  iterator iter_00;
  btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
  local_48;
  allocator_type *local_38;
  
  pbVar5 = end.node_;
  this_00 = begin.node_;
  iVar6 = end.position_;
  iVar3 = begin.position_;
  uVar8 = 0;
  local_48.node_ = this_00;
  local_48.position_ = iVar3;
  if (iVar6 != iVar3 || this_00 != pbVar5) {
    do {
      do {
        btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
        ::increment(&local_48);
        uVar8 = uVar8 + 1;
      } while (local_48.node_ != pbVar5);
    } while (local_48.position_ != iVar6);
  }
  if (-1 < (long)uVar8) {
    if (uVar8 == 0) {
      uVar8 = 0;
    }
    else {
      uVar4 = this->size_ - uVar8;
      if (uVar4 == 0) {
        if (this->size_ != 0) {
          btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
          ::clear_and_delete(this->root_,(allocator_type *)&this->rightmost_);
        }
        (this->rightmost_).
        super_CompressedTupleImpl<absl::container_internal::CompressedTuple<absl::container_internal::key_compare_adapter<compare_ptr,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>::checked_compare,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
        .
        super_Storage<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_*,_2UL,_false>
        .value = (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                  *)btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>
                    ::EmptyNode()::empty_node;
        this->root_ = (node_type *)
                      btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>
                      ::EmptyNode()::empty_node;
        this->size_ = 0;
        iVar9 = btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                ::end(this);
        this_00 = iVar9.node_;
        iVar3 = iVar9.position_;
      }
      else if (this_00 == pbVar5) {
        if (iVar6 - iVar3 == 0 || iVar6 < iVar3) {
          __assert_fail("end.position_ > begin.position_",
                        "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/container/internal/btree.h"
                        ,0x95b,
                        "std::pair<size_type, iterator> absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>>::erase_range(iterator, iterator) [Params = absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>]"
                       );
        }
        btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
        ::remove_values(this_00,(field_type)begin.position_,(field_type)(iVar6 - iVar3),
                        (allocator_type *)&this->rightmost_);
        this->size_ = this->size_ - uVar8;
        iVar9._12_4_ = 0;
        iVar9.node_ = (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                       *)SUB128(begin._0_12_,0);
        iVar9.position_ = SUB124(begin._0_12_,8);
        iVar9 = rebalance_after_delete(this,iVar9);
        this_00 = iVar9.node_;
        iVar3 = iVar9.position_;
      }
      else {
        uVar2 = this->size_;
        if (uVar4 < uVar2) {
          local_38 = (allocator_type *)&this->rightmost_;
          do {
            if (((ulong)this_00 & 7) != 0) {
              __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/container/internal/layout.h"
                            ,0x1e3,
                            "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *, unsigned int, unsigned char, std::unique_ptr<SeqEntry>, absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *, unsigned int, unsigned char, std::unique_ptr<SeqEntry>, absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
                           );
            }
            if (this_00[0xb] ==
                (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                 )0x0) {
              iter_00.position_ = iVar3;
              iter_00.node_ = this_00;
              iter_00._12_4_ = 0;
              iVar9 = erase(this,iter_00);
              auVar1 = iVar9._0_12_;
            }
            else {
              uVar7 = (ulong)(byte)this_00[10] - (long)iVar3;
              if (uVar2 - uVar4 < (ulong)(byte)this_00[10] - (long)iVar3) {
                uVar7 = uVar2 - uVar4;
              }
              btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
              ::remove_values(this_00,(field_type)iVar3,(field_type)uVar7,local_38);
              this->size_ = this->size_ - uVar7;
              iter.position_ = iVar3;
              iter.node_ = this_00;
              iter._12_4_ = 0;
              iVar9 = rebalance_after_delete(this,iter);
              auVar1 = iVar9._0_12_;
            }
            this_00 = auVar1._0_8_;
            iVar3 = auVar1._8_4_;
            uVar2 = this->size_;
          } while (uVar4 < uVar2);
        }
      }
    }
    __return_storage_ptr__->first = uVar8;
    (__return_storage_ptr__->second).node_ = this_00;
    (__return_storage_ptr__->second).position_ = iVar3;
    return __return_storage_ptr__;
  }
  __assert_fail("count >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/container/internal/btree.h"
                ,0x94f,
                "std::pair<size_type, iterator> absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>>::erase_range(iterator, iterator) [Params = absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>]"
               );
}

Assistant:

auto btree<P>::erase_range(iterator begin, iterator end)
    -> std::pair<size_type, iterator> {
  difference_type count = std::distance(begin, end);
  assert(count >= 0);

  if (count == 0) {
    return {0, begin};
  }

  if (static_cast<size_type>(count) == size_) {
    clear();
    return {count, this->end()};
  }

  if (begin.node_ == end.node_) {
    assert(end.position_ > begin.position_);
    begin.node_->remove_values(begin.position_, end.position_ - begin.position_,
                               mutable_allocator());
    size_ -= count;
    return {count, rebalance_after_delete(begin)};
  }

  const size_type target_size = size_ - count;
  while (size_ > target_size) {
    if (begin.node_->is_leaf()) {
      const size_type remaining_to_erase = size_ - target_size;
      const size_type remaining_in_node =
          begin.node_->finish() - begin.position_;
      const size_type to_erase =
          (std::min)(remaining_to_erase, remaining_in_node);
      begin.node_->remove_values(begin.position_, to_erase,
                                 mutable_allocator());
      size_ -= to_erase;
      begin = rebalance_after_delete(begin);
    } else {
      begin = erase(begin);
    }
  }
  begin.update_generation();
  return {count, begin};
}